

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

void __thiscall duckdb::BatchInsertLocalState::~BatchInsertLocalState(BatchInsertLocalState *this)

{
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__BatchInsertLocalState_027bd8a0;
  ::std::unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>::
  ~unique_ptr(&(this->constraint_state).
               super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
             );
  ::std::
  unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>::
  ~unique_ptr(&(this->optimistic_writer).
               super_unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
             );
  TableAppendState::~TableAppendState(&this->current_append_state);
  LocalSinkState::~LocalSinkState(&this->super_LocalSinkState);
  return;
}

Assistant:

BatchInsertLocalState(ClientContext &context, const vector<LogicalType> &types)
	    : collection_index(DConstants::INVALID_INDEX) {
	}